

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

void __thiscall Company::Company(Company *this,Company *cp)

{
  int iVar1;
  Boss *this_00;
  Employee **ppEVar2;
  Employee *this_01;
  ulong uVar3;
  long lVar4;
  
  this->budget = cp->budget;
  this_00 = (Boss *)operator_new(0xc0);
  Boss::Boss(this_00,cp->boss);
  this->boss = this_00;
  iVar1 = Boss::getNumberOfEmployees(this_00);
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar3 = (long)iVar1 * 8;
  }
  ppEVar2 = (Employee **)operator_new__(uVar3);
  this->employees = ppEVar2;
  iVar1 = Boss::getNumberOfEmployees(this->boss);
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      this_01 = (Employee *)operator_new(0xb8);
      Employee::Employee(this_01,cp->employees[lVar4]);
      this->employees[lVar4] = this_01;
      lVar4 = lVar4 + 1;
      iVar1 = Boss::getNumberOfEmployees(this->boss);
    } while (lVar4 < iVar1);
  }
  return;
}

Assistant:

Company::Company(const Company &cp) {
    budget = cp.budget;
    boss = new Boss(*cp.boss);
    employees = new Employee *[boss->getNumberOfEmployees()];
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        employees[i] = new Employee(*cp.employees[i]);
    }
}